

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cc
# Opt level: O3

base_learner * mf_setup(options_i *options,vw *all)

{
  long lVar1;
  undefined4 uVar2;
  size_t sVar3;
  int iVar4;
  mf *this;
  base_learner *l;
  single_learner *__src;
  learner<mf,_example> *__dest;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  _func_int ***local_170;
  _func_int **local_168;
  _func_int **local_160 [2];
  long local_150;
  option_group_definition local_148;
  long *local_110;
  long local_108;
  long local_100 [2];
  string local_f0;
  undefined1 local_d0 [112];
  bool local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  this = calloc_or_throw<mf>(1);
  memset(this,0,0xf8);
  local_d0._0_8_ = (_func_int **)0x1e;
  local_170 = local_160;
  local_170 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_170,(ulong)local_d0);
  local_160[0] = (_func_int **)local_d0._0_8_;
  builtin_strncpy((char *)((long)local_170 + 0xe),"zation R",8);
  builtin_strncpy((char *)((long)local_170 + 0x16),"eduction",8);
  *(undefined4 *)local_170 = 0x7274614d;
  builtin_strncpy((char *)((long)local_170 + 4),"ix F",4);
  *(undefined4 *)(local_170 + 1) = 0x6f746361;
  builtin_strncpy((char *)((long)local_170 + 0xc),"riza",4);
  local_168 = (_func_int **)local_d0._0_8_;
  *(char *)((long)local_170 + local_d0._0_8_) = '\0';
  local_148.m_name._M_dataplus._M_p = (pointer)&local_148.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,local_170,(char *)(local_d0._0_8_ + (long)local_170));
  local_148.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_170 != local_160) {
    operator_delete(local_170);
  }
  local_f0.field_2._M_allocated_capacity._0_4_ = 0x5f77656e;
  local_f0.field_2._M_allocated_capacity._4_2_ = 0x666d;
  local_f0._M_string_length = 6;
  local_f0.field_2._M_local_buf[6] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_d0,&local_f0,&this->rank);
  local_60 = true;
  local_150 = 0x2d;
  local_110 = local_100;
  local_110 = (long *)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)&local_150);
  local_100[0] = local_150;
  builtin_strncpy((char *)((long)local_110 + 0x1d),"ix facto",8);
  builtin_strncpy((char *)((long)local_110 + 0x25),"rization",8);
  local_110[2] = 0x64657361622d6e6f;
  local_110[3] = 0x2078697274616d20;
  *local_110 = 0x726f66206b6e6172;
  local_110[1] = 0x6974637564657220;
  local_108 = local_150;
  *(char *)((long)local_110 + local_150) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_148,(typed_option<unsigned_long> *)local_d0);
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  local_d0._0_8_ = &PTR__typed_option_002dc068;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_148);
  local_d0._16_4_ = 0x5f77656e;
  local_d0._20_2_ = 0x666d;
  local_d0._8_8_ = (pointer)0x6;
  local_d0[0x16] = 0;
  local_d0._0_8_ = local_d0 + 0x10;
  iVar4 = (*options->_vptr_options_i[1])(options,local_d0);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  if ((char)iVar4 == '\0') {
    __dest = (learner<mf,_example> *)0x0;
  }
  else {
    this->all = all;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->pairs,&all->pairs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&all->pairs);
    all->random_positive_weights = true;
    l = setup_base(options,all);
    __src = LEARNER::as_singleline<char,char>(l);
    sVar3 = this->rank;
    uVar2 = *(undefined4 *)(__src + 0xd0);
    __dest = calloc_or_throw<LEARNER::learner<mf,example>>(1);
    lVar1 = sVar3 * 2 + 1;
    memcpy(__dest,__src,0xe9);
    *(single_learner **)(__dest + 0x20) = __src;
    *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
    *(mf **)(__dest + 0xb8) = this;
    *(single_learner **)(__dest + 0xc0) = __src;
    *(code **)(__dest + 200) = LEARNER::noop;
    *(long *)(__dest + 0xd8) = lVar1;
    *(long *)(__dest + 0xe0) = lVar1 * *(long *)(__src + 0xe0);
    *(mf **)(__dest + 0x18) = this;
    *(code **)(__dest + 0x28) = learn;
    *(code **)(__dest + 0x38) = learn;
    *(code **)(__dest + 0x30) = predict<false>;
    *(undefined8 *)(__dest + 0x40) = 0;
    *(undefined4 *)(__dest + 0xd0) = uVar2;
    __dest[0xe8] = (learner<mf,_example>)0x0;
    *(mf **)(__dest + 0xb8) = this;
    *(single_learner **)(__dest + 0xc0) = __src;
    *(code **)(__dest + 200) = finish;
    this = (mf *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_148.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.m_name._M_dataplus._M_p != &local_148.m_name.field_2) {
    operator_delete(local_148.m_name._M_dataplus._M_p);
  }
  if (this != (mf *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&this->pairs);
    free(this);
  }
  return (base_learner *)__dest;
}

Assistant:

base_learner* mf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<mf>();
  option_group_definition new_options("Matrix Factorization Reduction");
  new_options.add(make_option("new_mf", data->rank).keep().help("rank for reduction-based matrix factorization"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("new_mf"))
    return nullptr;

  data->all = &all;
  // store global pairs in local data structure and clear global pairs
  // for eventual calls to base learner
  data->pairs = all.pairs;
  all.pairs.clear();

  all.random_positive_weights = true;

  learner<mf, example>& l =
      init_learner(data, as_singleline(setup_base(options, all)), learn, predict<false>, 2 * data->rank + 1);
  l.set_finish(finish);
  return make_base(l);
}